

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopStart<(Js::LayoutSize)2,false>
          (InterpreterStackFrame *this,byte *ip)

{
  uint uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar5;
  undefined4 *puVar6;
  byte *local_30;
  byte *ip_local;
  
  local_30 = ip;
  pOVar5 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     ((ByteCodeReader *)this,&local_30);
  if (((byte)this[0xd6] & 0x10) != 0) {
    uVar1 = pOVar5->C1;
    lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
    if (*(char *)(lVar2 + 0x1658) != -1) {
      *(char *)(lVar2 + 0x1658) = *(char *)(lVar2 + 0x1658) + '\x01';
    }
    bVar4 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16b3,
                                  "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                  ,
                                  "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    *(undefined1 *)(*(long *)(this + 0xc0) + (ulong)uVar1) = *(undefined1 *)(lVar2 + 0x1570);
    *(undefined1 *)(lVar2 + 0x1570) = 1;
    *(undefined4 *)(this + 0xd0) = 0;
  }
  return local_30;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopStart(const byte * ip)
    {
        const uint32 C1 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->IncrementLoopDepth();

        // Save the implicit call flags. The interpreter may switch to profiling mode during LoopBodyStart, so always do this.
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        this->savedLoopImplicitCallFlags[C1] = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags(ImplicitCall_None);

        this->currentLoopCounter = 0;

        if (!profiled)
        {
            return ip;
        }

        LayoutSize localLayoutSize;
        OpCode peekOp = m_reader.PeekOp(ip, localLayoutSize);
        Assert(peekOp != OpCode::LoopBodyStart);
        if (peekOp == OpCode::ProfiledLoopBodyStart)
        {
            Assert(localLayoutSize == layoutSize);
            ip += Js::OpCodeUtil::EncodedSize(peekOp, layoutSize);
            // We are doing JIT loop body. Process the first ProfiledLoopBodyStart to avoid recording
            // the implicit call before the first iteration
            uint32 C2 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
            Assert(C1 == C2);
            (this->*opProfiledLoopBodyStart)(C1, layoutSize, true /* isFirstIteration */);
            return m_reader.GetIP();
        }

        return ip;
    }